

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void fejer1_compute(int n,double *x,double *w)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FEJER1_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
    exit(1);
  }
  if (n != 1) {
    pvVar3 = operator_new__((ulong)(uint)n * 8);
    iVar2 = n * 2 + -1;
    uVar4 = 0;
    do {
      *(double *)((long)pvVar3 + uVar4 * 8) = ((double)iVar2 * 3.141592653589793) / (double)(n * 2);
      iVar2 = iVar2 + -2;
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
    uVar4 = 1;
    if (1 < n) {
      uVar4 = (ulong)(uint)n;
    }
    uVar6 = 0;
    do {
      dVar8 = cos(*(double *)((long)pvVar3 + uVar6 * 8));
      x[uVar6] = dVar8;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    uVar6 = 0;
    uVar4 = 1;
    if (1 < n) {
      uVar4 = (ulong)(uint)n;
    }
    do {
      w[uVar6] = 1.0;
      iVar7 = 4;
      uVar5 = 2;
      iVar2 = 1;
      do {
        dVar8 = w[uVar6];
        dVar9 = cos((double)uVar5 * *(double *)((long)pvVar3 + uVar6 * 8));
        w[uVar6] = dVar8 - (dVar9 + dVar9) / (double)(iVar7 * iVar2 + -1);
        iVar1 = iVar2 + (-(uint)((uint)n >> 1 == 0) - ((uint)n >> 1));
        iVar2 = iVar2 + 1;
        iVar7 = iVar7 + 4;
        uVar5 = uVar5 + 2;
      } while (iVar1 != 0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar4);
    uVar4 = 1;
    if (1 < n) {
      uVar4 = (ulong)(uint)n;
    }
    uVar6 = 0;
    do {
      w[uVar6] = (w[uVar6] + w[uVar6]) / (double)n;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    operator_delete__(pvVar3);
    return;
  }
  *x = 0.0;
  *w = 2.0;
  return;
}

Assistant:

void fejer1_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER1_COMPUTE computes a Fejer type 1 quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.  The paper by Waldvogel
//    exhibits a more efficient approach using Fourier transforms.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int j;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "FEJER1_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( 2 * ( n - i ) + 1 ) * r8_pi
               / double( 2 * n     );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;
    for ( j = 1; j <= ( n / 2 ); j++ )
    {
      w[i] = w[i] - 2.0
        * cos ( 2.0 * double( j ) * theta[i] ) 
        / double( 4 * j * j - 1 );
    }
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 2.0 * w[i] / double( n );
  }

  delete [] theta;

  return;
}